

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O0

int socket_server_poll(socket_server *ss,socket_message *result,int *more)

{
  uint16_t uVar1;
  socket *s_00;
  int iVar2;
  event *peVar3;
  int local_48;
  int type_2;
  int type_1;
  int ok;
  socket *s;
  event *e;
  int type;
  int *more_local;
  socket_message *result_local;
  socket_server *ss_local;
  
LAB_00111344:
  do {
    if (ss->checkctrl != 0) {
      iVar2 = has_cmd(ss);
      if (iVar2 != 0) {
        iVar2 = ctrl_cmd(ss,result);
        if (iVar2 != -1) {
          clear_closed_event(ss,result,iVar2);
          return iVar2;
        }
        goto LAB_00111344;
      }
      ss->checkctrl = 0;
    }
    if (ss->event_index == ss->event_n) {
      iVar2 = sp_wait(ss->event_fd,ss->ev,0x40);
      ss->event_n = iVar2;
      ss->checkctrl = 1;
      if (more != (int *)0x0) {
        *more = 0;
      }
      ss->event_index = 0;
      if (ss->event_n < 1) {
        ss->event_n = 0;
        return -1;
      }
    }
    iVar2 = ss->event_index;
    ss->event_index = iVar2 + 1;
    peVar3 = ss->ev + iVar2;
    s_00 = (socket *)peVar3->s;
    if (s_00 != (socket *)0x0) {
      uVar1 = s_00->type;
      if (uVar1 == 0) {
        fprintf(_stderr,"socket-server: invalid socket\n");
      }
      else if (uVar1 == 3) {
        iVar2 = report_accept(ss,s_00,result);
        if (0 < iVar2) {
          return 3;
        }
        if (iVar2 < 0) {
          return 4;
        }
      }
      else {
        if (uVar1 == 4) {
          iVar2 = report_connect(ss,s_00,result);
          return iVar2;
        }
        if ((peVar3->read & 1U) == 0) {
          if (((peVar3->write & 1U) != 0) && (iVar2 = send_buffer(ss,s_00,result), iVar2 != -1)) {
            return iVar2;
          }
        }
        else {
          if (s_00->protocol == 0) {
            local_48 = forward_message_tcp(ss,s_00,result);
          }
          else {
            local_48 = forward_message_udp(ss,s_00,result);
            if (local_48 == 6) {
              ss->event_index = ss->event_index + -1;
              return 6;
            }
          }
          if ((((peVar3->write & 1U) != 0) && (local_48 != 1)) && (local_48 != 4)) {
            peVar3->read = false;
            ss->event_index = ss->event_index + -1;
          }
          if (local_48 != -1) {
            return local_48;
          }
        }
      }
    }
  } while( true );
}

Assistant:

int 
socket_server_poll(struct socket_server *ss, struct socket_message * result, int * more) {
	for (;;) {
		if (ss->checkctrl) {
			if (has_cmd(ss)) {
				int type = ctrl_cmd(ss, result);
				if (type != -1) {
					clear_closed_event(ss, result, type);
					return type;
				} else
					continue;
			} else {
				ss->checkctrl = 0;
			}
		}
		if (ss->event_index == ss->event_n) {
			ss->event_n = sp_wait(ss->event_fd, ss->ev, MAX_EVENT);
			ss->checkctrl = 1;
			if (more) {
				*more = 0;
			}
			ss->event_index = 0;
			if (ss->event_n <= 0) {
				ss->event_n = 0;
				return -1;
			}
		}
		struct event *e = &ss->ev[ss->event_index++];
		struct socket *s = e->s;
		if (s == NULL) {
			// dispatch pipe message at beginning
			continue;
		}
		switch (s->type) {
		case SOCKET_TYPE_CONNECTING:
			return report_connect(ss, s, result);
		case SOCKET_TYPE_LISTEN: {
			int ok = report_accept(ss, s, result);
			if (ok > 0) {
				return SOCKET_ACCEPT;
			} if (ok < 0 ) {
				return SOCKET_ERROR;
			}
			// when ok == 0, retry
			break;
		}
		case SOCKET_TYPE_INVALID:
			fprintf(stderr, "socket-server: invalid socket\n");
			break;
		default:
			if (e->read) {
				int type;
				if (s->protocol == PROTOCOL_TCP) {
					type = forward_message_tcp(ss, s, result);
				} else {
					type = forward_message_udp(ss, s, result);
					if (type == SOCKET_UDP) {
						// try read again
						--ss->event_index;
						return SOCKET_UDP;
					}
				}
				if (e->write && type != SOCKET_CLOSE && type != SOCKET_ERROR) {
					// Try to dispatch write message next step if write flag set.
					e->read = false;
					--ss->event_index;
				}
				if (type == -1)
					break;				
				return type;
			}
			if (e->write) {
				int type = send_buffer(ss, s, result);
				if (type == -1)
					break;
				return type;
			}
			break;
		}
	}
}